

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O0

void __thiscall KMeans::KMeans(KMeans *this,shared_ptr<Launcher> *launcher,size_t k,size_t kappa)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  char *__lhs;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  size_t clusterID;
  TDNode *node;
  Attribute *att;
  size_t var;
  KMeans *in_stack_00000520;
  Launcher *in_stack_fffffffffffffe38;
  TreeDecomposition *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  byte in_stack_fffffffffffffe4f;
  TreeDecomposition *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffee8;
  undefined1 *in_stack_fffffffffffffef0;
  Type t;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  bool in_stack_ffffffffffffff07;
  pair<bool,_double> in_stack_ffffffffffffff08;
  string local_e8 [32];
  double local_c8;
  bool local_b9;
  pair<bool,_double> local_b8;
  string local_a8 [32];
  reference local_88;
  TDNode *local_78;
  Attribute *local_70;
  reference local_68;
  Launcher *local_58;
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  Application::Application((Application *)in_stack_fffffffffffffe40);
  *in_RDI = &PTR__KMeans_0037fb78;
  std::__cxx11::string::string((string *)(in_RDI + 10));
  std::shared_ptr<Launcher>::shared_ptr
            ((shared_ptr<Launcher> *)in_stack_fffffffffffffe40,
             (shared_ptr<Launcher> *)in_stack_fffffffffffffe38);
  std::shared_ptr<QueryCompiler>::shared_ptr((shared_ptr<QueryCompiler> *)0x2567c8);
  std::shared_ptr<TreeDecomposition>::shared_ptr((shared_ptr<TreeDecomposition> *)0x2567e4);
  in_RDI[0x14] = local_18;
  in_RDI[0x15] = local_20;
  in_RDI[0x17] = 0;
  std::bitset<100UL>::bitset((bitset<100UL> *)0x256821);
  std::
  vector<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>::
  vector((vector<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
          *)0x25683d);
  std::
  vector<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>::
  vector((vector<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
          *)0x256859);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x256866);
  Launcher::getCompiler(in_stack_fffffffffffffe38);
  std::shared_ptr<QueryCompiler>::operator=
            ((shared_ptr<QueryCompiler> *)in_stack_fffffffffffffe40,
             (shared_ptr<QueryCompiler> *)in_stack_fffffffffffffe38);
  std::shared_ptr<QueryCompiler>::~shared_ptr((shared_ptr<QueryCompiler> *)0x2568a0);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x2568ad);
  Launcher::getTreeDecomposition(in_stack_fffffffffffffe38);
  std::shared_ptr<TreeDecomposition>::operator=
            ((shared_ptr<TreeDecomposition> *)in_stack_fffffffffffffe40,
             (shared_ptr<TreeDecomposition> *)in_stack_fffffffffffffe38);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x2568ea);
  loadFeatures(in_stack_00000520);
  peVar3 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x25690d);
  __lhs = (char *)TreeDecomposition::numberOfAttributes(peVar3);
  in_RDI[0x16] = __lhs;
  for (local_58 = (Launcher *)0x0; local_58 < (Launcher *)0x64;
      local_58 = (Launcher *)
                 ((long)&(local_58->super_enable_shared_from_this<Launcher>)._M_weak_this.
                         super___weak_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1)) {
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (size_t)in_stack_fffffffffffffe40);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffe40);
    bVar2 = bVar1 ^ 0xff;
    std::bitset<100UL>::reference::~reference(&local_68);
    t = (Type)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    if ((bVar2 & 1) == 0) {
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2569ca);
      local_70 = TreeDecomposition::getAttribute
                           (in_stack_fffffffffffffe50,
                            CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x256a02);
      local_78 = TreeDecomposition::getRelation
                           (in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                 (size_t)in_stack_fffffffffffffe40);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffe40);
      std::bitset<100UL>::reference::~reference(&local_88);
      if (bVar1) {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x256a9b);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(bVar2,in_stack_fffffffffffffe80));
        local_b9 = true;
        local_c8 = 0.0;
        std::pair<bool,_double>::pair<bool,_double,_true>(&local_b8,&local_b9,&local_c8);
        TreeDecomposition::addAttribute
                  ((TreeDecomposition *)
                   CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,t,in_stack_ffffffffffffff08,in_stack_fffffffffffffee8);
        std::__cxx11::string::~string(local_a8);
      }
      else {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x256b73);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(bVar2,in_stack_fffffffffffffe80));
        in_stack_ffffffffffffff07 = true;
        in_stack_fffffffffffffef8 = (string *)0x0;
        std::pair<bool,_double>::pair<bool,_double,_true>
                  ((pair<bool,_double> *)&stack0xffffffffffffff08,(bool *)&stack0xffffffffffffff07,
                   (double *)&stack0xfffffffffffffef8);
        TreeDecomposition::addAttribute
                  ((TreeDecomposition *)
                   CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,t,in_stack_ffffffffffffff08,in_stack_fffffffffffffee8);
        std::__cxx11::string::~string(local_e8);
      }
      peVar3 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x256c4b);
      in_stack_fffffffffffffe50 = (TreeDecomposition *)TreeDecomposition::numberOfAttributes(peVar3)
      ;
      in_stack_fffffffffffffef0 =
           (undefined1 *)
           ((long)&in_stack_fffffffffffffe50[-1]._relationsMap._M_h._M_single_bucket + 7);
      std::bitset<100UL>::set
                ((bitset<100UL> *)in_stack_fffffffffffffe50,
                 CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                 SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                 (size_t)in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe4f =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffe40);
      std::bitset<100UL>::reference::~reference((reference *)&stack0xfffffffffffffee0);
      if ((in_stack_fffffffffffffe4f & 1) != 0) {
        std::bitset<100UL>::set
                  ((bitset<100UL> *)in_stack_fffffffffffffe50,
                   CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                   SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
      }
      in_stack_fffffffffffffe38 = local_58;
      in_stack_fffffffffffffe40 =
           (TreeDecomposition *)
           std::
           unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffe40,(key_type *)local_58);
      in_stack_fffffffffffffe40->_root = (TDNode *)in_stack_fffffffffffffe38;
    }
  }
  return;
}

Assistant:

KMeans::KMeans(std::shared_ptr<Launcher> launcher, const size_t k, const size_t kappa) :
    _launcher(launcher), _k(k), _dimensionK(kappa)
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();

    // This should be modified in case you want to a different k for each dimension
    // _dimensionK = _k;
    
    loadFeatures();

    numberOfOriginalVariables = _td->numberOfAttributes();

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_isFeature[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        TDNode* node = _td->getRelation(_queryRootIndex[var]);

        if (_isCategoricalFeature[var]) 
            _td->addAttribute("cluster_"+att->_name,Type::Integer,{true,0.0},node->_id);
        else
            _td->addAttribute("cluster_"+att->_name,Type::Double,{true,0.0},node->_id);
            
        size_t clusterID = _td->numberOfAttributes()-1;
        
        clusterVariables.set(clusterID);

        if (_isCategoricalFeature[var])
            _isCategoricalFeature.set(clusterID);

        clusterToVariableMap[clusterID] = var;   
    }
}